

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::EntryCall(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  int n;
  CallFlags e;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *this;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar8;
  JavascriptMethod entryPoint;
  Arguments local_98 [2];
  undefined1 local_78 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint i;
  RecyclableObject *pFunc;
  uint argCount;
  ScriptContext *scriptContext;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x27c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x27f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar2 = local_40._0_4_;
  if (((ulong)local_40 & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,0);
    bVar3 = JavascriptConversion::IsCallable(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[]((Arguments *)local_40,0);
      this = VarTo<Js::RecyclableObject>(pvVar7);
      if ((uVar2 & 0xffffff) == 1) {
        this_00 = ScriptContext::GetLibrary(pSVar4);
        pRVar8 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        *(RecyclableObject **)args.Info = pRVar8;
      }
      else {
        for (autoReentrancyHandler._12_4_ = 0;
            (uint)autoReentrancyHandler._12_4_ < (local_40._0_4_ & 0xffffff) - 1;
            autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1) {
          *(undefined8 *)((long)args.Info + (ulong)(uint)autoReentrancyHandler._12_4_ * 8) =
               *(undefined8 *)((long)args.Info + (ulong)(autoReentrancyHandler._12_4_ + 1) * 8);
        }
        local_40 = (undefined1  [8])
                   ((ulong)local_40 & 0xffffffffff000000 |
                   (ulong)((local_40._0_4_ & 0xffffff) - 1) & 0xffffff);
      }
      pTVar5 = ScriptContext::GetThreadContext(pSVar4);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_78,pTVar5);
      entryPoint = RecyclableObject::GetEntryPoint(this);
      Arguments::Arguments(local_98,(Arguments *)local_40);
      pvVar7 = CallFunction<true>(this,entryPoint,local_98,true);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_78);
      return pvVar7;
    }
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec40,L"Function.prototype.call");
}

Assistant:

Var JavascriptFunction::EntryCall(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        ///
        /// Check Argument[0] has internal [[Call]] property
        /// If not, throw TypeError
        ///
        uint argCount = args.Info.Count;
        if (argCount == 0 || !JavascriptConversion::IsCallable(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("Function.prototype.call"));
        }

        RecyclableObject *pFunc = VarTo<RecyclableObject>(args[0]);
        if (argCount == 1)
        {
            args.Values[0] = scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            ///
            /// Remove function object from the arguments and pass the rest
            ///
            for (uint i = 0; i < args.Info.Count - 1; ++i)
            {
                args.Values[i] = args.Values[i + 1];
            }
            args.Info.Count = args.Info.Count - 1;
        }

        ///
        /// Call the [[Call]] method on the function object
        ///
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return JavascriptFunction::CallFunction<true>(pFunc, pFunc->GetEntryPoint(), args, true /*useLargeArgCount*/);
        }
        END_SAFE_REENTRANT_CALL
    }